

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O3

LatticePathWithScore * __thiscall
sentencepiece::unigram::Lattice::Viterbi(LatticePathWithScore *__return_storage_ptr__,Lattice *this)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer ppNVar4;
  Node *pNVar5;
  pointer ppNVar6;
  long lVar7;
  Node **ppNVar8;
  LatticePathWithScore *pLVar9;
  Node *pNVar10;
  int iVar11;
  Node **ppNVar12;
  ostream *poVar13;
  uint uVar14;
  Node **ppNVar15;
  ulong uVar16;
  pointer ppNVar17;
  value_type *__range4;
  Node *pNVar18;
  pointer ppNVar19;
  float fVar20;
  float fVar21;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  results;
  LatticePathWithScore *retval;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  local_68;
  Node *local_48;
  float local_3c;
  LatticePathWithScore *local_38;
  
  pvVar2 = (this->begin_nodes_).
           super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar14 = (int)((ulong)((long)(this->surface_).
                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->surface_).
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  uVar16 = 0;
  if ((int)uVar14 < 1) {
    uVar14 = 0;
  }
  pvVar3 = (this->end_nodes_).
           super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    ppNVar17 = pvVar2[uVar16].
               super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppNVar4 = *(pointer *)
               ((long)&pvVar2[uVar16].
                       super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                       ._M_impl.super__Vector_impl_data + 8);
    local_38 = __return_storage_ptr__;
    if (ppNVar17 != ppNVar4) {
      pvVar1 = pvVar3 + uVar16;
      do {
        pNVar5 = *ppNVar17;
        pNVar5->prev = (Node *)0x0;
        ppNVar19 = (pvVar1->
                   super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppNVar6 = *(pointer *)
                   ((long)&(pvVar1->
                           super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                           )._M_impl.super__Vector_impl_data + 8);
        if (ppNVar19 == ppNVar6) {
LAB_001f187f:
          iVar11 = logging::GetMinLogLevel();
          pLVar9 = local_38;
          if (iVar11 < 3) {
            local_68.
            super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_68.
                                  super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"unigram_model.cc",0x10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
            poVar13 = (ostream *)std::ostream::operator<<(&std::cerr,0xb1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,") ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"LOG(",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"ERROR",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,") ",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,"Failed to find the best path in Viterbi.",0x28);
            error::Die::~Die((Die *)&local_68);
          }
          *(undefined8 *)
           ((long)&(pLVar9->first).
                   super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
          *(undefined8 *)
           ((long)&(pLVar9->first).
                   super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
          (pLVar9->first).
          super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pLVar9->first).
          super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          return pLVar9;
        }
        pNVar18 = (Node *)0x0;
        fVar21 = 0.0;
        do {
          fVar20 = (*ppNVar19)->backtrace_score + pNVar5->score;
          pNVar10 = *ppNVar19;
          if (fVar20 <= fVar21 && pNVar18 != (Node *)0x0) {
            fVar20 = fVar21;
            pNVar10 = pNVar18;
          }
          pNVar18 = pNVar10;
          ppNVar19 = ppNVar19 + 1;
          fVar21 = fVar20;
        } while (ppNVar19 != ppNVar6);
        if (pNVar18 == (Node *)0x0) goto LAB_001f187f;
        pNVar5->prev = pNVar18;
        pNVar5->backtrace_score = fVar20;
        ppNVar17 = ppNVar17 + 1;
      } while (ppNVar17 != ppNVar4);
    }
    uVar16 = uVar16 + 1;
    if (uVar16 == uVar14 + 1) {
      local_68.
      super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (Node **)0x0;
      local_68.
      super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (Node **)0x0;
      local_68.
      super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (Node **)0x0;
      lVar7 = **(long **)&pvVar2[uVar14].
                          super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                          ._M_impl.super__Vector_impl_data;
      local_3c = *(float *)(lVar7 + 0x24);
      local_48 = *(Node **)(lVar7 + 0x28);
      if (local_48->prev != (Node *)0x0) {
        do {
          if (local_68.
              super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_68.
              super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<sentencepiece::unigram::Lattice::Node*,std::allocator<sentencepiece::unigram::Lattice::Node*>>
            ::_M_realloc_insert<sentencepiece::unigram::Lattice::Node*const&>
                      ((vector<sentencepiece::unigram::Lattice::Node*,std::allocator<sentencepiece::unigram::Lattice::Node*>>
                        *)&local_68,
                       (iterator)
                       local_68.
                       super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_48);
          }
          else {
            *local_68.
             super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = local_48;
            local_68.
            super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_68.
                 super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          local_48 = local_48->prev;
        } while (local_48->prev != (Node *)0x0);
        ppNVar15 = local_68.
                   super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
        ppNVar8 = local_68.
                  super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_68.
            super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start < ppNVar15 &&
            local_68.
            super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_68.
            super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            ppNVar12 = ppNVar8 + 1;
            pNVar5 = *ppNVar8;
            *ppNVar8 = *ppNVar15;
            *ppNVar15 = pNVar5;
            ppNVar15 = ppNVar15 + -1;
            ppNVar8 = ppNVar12;
          } while (ppNVar12 < ppNVar15);
        }
      }
      pLVar9 = local_38;
      std::
      vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ::vector(&local_38->first,&local_68);
      pLVar9->second = local_3c;
      if (local_68.
          super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (Node **)0x0) {
        operator_delete(local_68.
                        super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return pLVar9;
    }
  } while( true );
}

Assistant:

Lattice::LatticePathWithScore Lattice::Viterbi() {
  const int len = size();

  for (int pos = 0; pos <= len; ++pos) {
    for (Node *rnode : begin_nodes_[pos]) {
      rnode->prev = nullptr;
      float best_score = 0.0;
      Node *best_node = nullptr;
      for (Node *lnode : end_nodes_[pos]) {
        const float score = lnode->backtrace_score + rnode->score;
        if (best_node == nullptr || score > best_score) {
          best_node = lnode;
          best_score = score;
        }
      }
      if (best_node == nullptr) {
        LOG(ERROR) << "Failed to find the best path in Viterbi.";
        return {};
      }
      rnode->prev = best_node;
      rnode->backtrace_score = best_score;
    }
  }

  // backtrace
  std::vector<Node *> results;
  float score = begin_nodes(len)[0]->backtrace_score;
  for (Node *node = begin_nodes_[len][0]->prev; node->prev != nullptr;
       node = node->prev) {
    results.push_back(node);
  }

  std::reverse(results.begin(), results.end());

  LatticePathWithScore retval = {results, score};

  return retval;
}